

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O0

bool __thiscall FZipFile::Open(FZipFile *this,bool quiet)

{
  FileReader *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  FZipLump *pFVar7;
  FZipLump *pFVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  FZipLump *local_c8;
  FString local_98;
  int local_8c;
  FString local_88;
  FString name;
  int len;
  FZipCentralDirectoryInfo *zip_fh;
  FZipLump *pFStack_68;
  DWORD i;
  FZipLump *lump_p;
  char *dirptr;
  void *directory;
  int dirsize;
  int local_3c;
  undefined1 local_36 [2];
  int skipped;
  short local_30;
  FZipEndOfCentralDirectory info;
  DWORD centraldir;
  bool quiet_local;
  FZipFile *this_local;
  
  info.ZipCommentLength._1_1_ = quiet;
  info._14_4_ = Zip_FindCentralDir((this->super_FResourceFile).Reader);
  local_3c = 0;
  this->Lumps = (FZipLump *)0x0;
  if (info._14_4_ == 0) {
    if ((info.ZipCommentLength._1_1_ & 1) == 0) {
      Printf("\x1cG\n%s: ZIP file corrupt!\n",(this->super_FResourceFile).Filename);
    }
    this_local._7_1_ = 0;
  }
  else {
    pFVar1 = (this->super_FResourceFile).Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)(uint)info._14_4_,0);
    pFVar1 = (this->super_FResourceFile).Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,local_36,0x16);
    if ((((ushort)info.Magic == info.Magic._2_2_) && (local_30 == 0)) && (skipped._2_2_ == 0)) {
      (this->super_FResourceFile).NumLumps = (uint)(ushort)info.Magic;
      uVar4 = CONCAT44(0,(this->super_FResourceFile).NumLumps);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar5 = SUB168(auVar2 * ZEXT816(0x60),0);
      uVar11 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x60),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar11 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar11);
      *puVar6 = uVar4;
      pFVar7 = (FZipLump *)(puVar6 + 1);
      if (uVar4 != 0) {
        local_c8 = pFVar7;
        do {
          FZipLump::FZipLump(local_c8);
          local_c8 = local_c8 + 1;
        } while (local_c8 != pFVar7 + uVar4);
      }
      this->Lumps = pFVar7;
      pFVar7 = (FZipLump *)malloc((long)(int)info._4_4_);
      pFVar1 = (this->super_FResourceFile).Reader;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)(uint)info._8_4_,0);
      pFVar1 = (this->super_FResourceFile).Reader;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,pFVar7,(long)(int)info._4_4_)
      ;
      pFStack_68 = this->Lumps;
      lump_p = pFVar7;
      for (zip_fh._4_4_ = 0; zip_fh._4_4_ < (this->super_FResourceFile).NumLumps;
          zip_fh._4_4_ = zip_fh._4_4_ + 1) {
        name.Chars._4_4_ = (uint)*(ushort *)((long)&(lump_p->super_FResourceLump).field_3 + 4);
        FString::FString(&local_88,&(lump_p->super_FResourceLump).field_0x2e,
                         (long)(int)name.Chars._4_4_);
        pFVar8 = (FZipLump *)
                 (&(lump_p->super_FResourceLump).field_0x2e +
                 (ulong)*(ushort *)((long)&(lump_p->super_FResourceLump).field_3 + 4) +
                 (ulong)*(ushort *)((long)&(lump_p->super_FResourceLump).field_3 + 6) +
                 (ulong)*(ushort *)((long)&(lump_p->super_FResourceLump).field_3 + 8));
        if ((FZipLump *)
            ((long)&(pFVar7->super_FResourceLump)._vptr_FResourceLump + (long)(int)info._4_4_) <
            pFVar8) {
          free(pFVar7);
          if ((info.ZipCommentLength._1_1_ & 1) == 0) {
            Printf("\x1cG\n%s: Central directory corrupted.",(this->super_FResourceFile).Filename);
          }
          this_local._7_1_ = 0;
          local_8c = 1;
        }
        else {
          pcVar9 = FString::operator[](&local_88,name.Chars._4_4_ - 1);
          if ((*pcVar9 == '/') && ((lump_p->super_FResourceLump).field_3.dwName == 0)) {
            local_3c = local_3c + 1;
            local_8c = 4;
          }
          else {
            *(undefined2 *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) =
                 *(undefined2 *)((long)&(lump_p->super_FResourceLump).LumpSize + 2);
            if ((((*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 0) ||
                 ((*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 8 ||
                  (*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 0xe)))) ||
                (*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 0xc)) ||
               ((*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 6 ||
                (*(short *)((long)&(lump_p->super_FResourceLump).LumpSize + 2) == 1)))) {
              *(short *)&(lump_p->super_FResourceLump).LumpSize =
                   (short)(lump_p->super_FResourceLump).LumpSize;
              if (((lump_p->super_FResourceLump).LumpSize & 1) == 0) {
                FixPathSeperator(&local_88);
                FString::ToLower(&local_88);
                FString::FString(&local_98,&local_88);
                FResourceLump::LumpNameSetup(&pFStack_68->super_FResourceLump,&local_98);
                FString::~FString(&local_98);
                (pFStack_68->super_FResourceLump).LumpSize =
                     (lump_p->super_FResourceLump).field_3.dwName;
                (pFStack_68->super_FResourceLump).Owner = &this->super_FResourceFile;
                (pFStack_68->super_FResourceLump).Flags = 0x82;
                (pFStack_68->super_FResourceLump).field_0x4e =
                     *(undefined1 *)((long)&(lump_p->super_FResourceLump).LumpSize + 2);
                *(short *)&(pFStack_68->super_FResourceLump).field_0x4c =
                     (short)(lump_p->super_FResourceLump).LumpSize;
                pFStack_68->CRC32 = *(uint *)&(lump_p->super_FResourceLump).FullName.Chars;
                pFStack_68->CompressedSize =
                     *(int *)((long)&(lump_p->super_FResourceLump).FullName.Chars + 4);
                pFStack_68->Position = *(int *)&(lump_p->super_FResourceLump).field_0x2a;
                FResourceLump::CheckEmbedded(&pFStack_68->super_FResourceLump);
                pcVar9 = FString::operator_cast_to_char_(&local_88);
                iVar3 = strcasecmp("dehacked.exe",pcVar9);
                if (iVar3 == 0) {
                  memset(&(pFStack_68->super_FResourceLump).field_3,0,9);
                }
                pFStack_68 = pFStack_68 + 1;
                local_8c = 0;
              }
              else {
                if ((info.ZipCommentLength._1_1_ & 1) == 0) {
                  pcVar9 = (this->super_FResourceFile).Filename;
                  pcVar10 = FString::GetChars(&local_88);
                  Printf("\x1cK\n%s: \'%s\' is encrypted. Encryption is not supported.\n",pcVar9,
                         pcVar10);
                }
                local_3c = local_3c + 1;
                local_8c = 4;
              }
            }
            else {
              if ((info.ZipCommentLength._1_1_ & 1) == 0) {
                pcVar9 = (this->super_FResourceFile).Filename;
                pcVar10 = FString::GetChars(&local_88);
                Printf("\x1cK\n%s: \'%s\' uses an unsupported compression algorithm (#%d).\n",pcVar9
                       ,pcVar10,(ulong)*(ushort *)
                                        ((long)&(lump_p->super_FResourceLump).LumpSize + 2));
              }
              local_3c = local_3c + 1;
              local_8c = 4;
            }
          }
        }
        FString::~FString(&local_88);
        if ((local_8c != 0) && (local_8c == 1)) goto LAB_006d93ac;
        lump_p = pFVar8;
      }
      (this->super_FResourceFile).NumLumps = (this->super_FResourceFile).NumLumps - local_3c;
      free(pFVar7);
      if (((info.ZipCommentLength._1_1_ & 1) == 0) && ((batchrun & 1U) == 0)) {
        Printf("\x1c-, %d lumps\n",(ulong)(this->super_FResourceFile).NumLumps);
      }
      FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x60);
      this_local._7_1_ = 1;
    }
    else {
      if ((info.ZipCommentLength._1_1_ & 1) == 0) {
        Printf("\x1cG\n%s: Multipart Zip files are not supported.\n",
               (this->super_FResourceFile).Filename);
      }
      this_local._7_1_ = 0;
    }
  }
LAB_006d93ac:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FZipFile::Open(bool quiet)
{
	DWORD centraldir = Zip_FindCentralDir(Reader);
	FZipEndOfCentralDirectory info;
	int skipped = 0;

	Lumps = NULL;

	if (centraldir == 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: ZIP file corrupt!\n", Filename);
		return false;
	}

	// Read the central directory info.
	Reader->Seek(centraldir, SEEK_SET);
	Reader->Read(&info, sizeof(FZipEndOfCentralDirectory));

	// No multi-disk zips!
	if (info.NumEntries != info.NumEntriesOnAllDisks ||
		info.FirstDisk != 0 || info.DiskNumber != 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Multipart Zip files are not supported.\n", Filename);
		return false;
	}

	NumLumps = LittleShort(info.NumEntries);
	Lumps = new FZipLump[NumLumps];

	// Load the entire central directory. Too bad that this contains variable length entries...
	int dirsize = LittleLong(info.DirectorySize);
	void *directory = malloc(dirsize);
	Reader->Seek(LittleLong(info.DirectoryOffset), SEEK_SET);
	Reader->Read(directory, dirsize);

	char *dirptr = (char*)directory;
	FZipLump *lump_p = Lumps;
	for (DWORD i = 0; i < NumLumps; i++)
	{
		FZipCentralDirectoryInfo *zip_fh = (FZipCentralDirectoryInfo *)dirptr;

		int len = LittleShort(zip_fh->NameLength);
		FString name(dirptr + sizeof(FZipCentralDirectoryInfo), len);
		dirptr += sizeof(FZipCentralDirectoryInfo) + 
				  LittleShort(zip_fh->NameLength) + 
				  LittleShort(zip_fh->ExtraLength) + 
				  LittleShort(zip_fh->CommentLength);

		if (dirptr > ((char*)directory) + dirsize)	// This directory entry goes beyond the end of the file.
		{
			free(directory);
			if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Central directory corrupted.", Filename);
			return false;
		}
		
		// skip Directories
		if (name[len - 1] == '/' && LittleLong(zip_fh->UncompressedSize) == 0) 
		{
			skipped++;
			continue;
		}

		// Ignore unknown compression formats
		zip_fh->Method = LittleShort(zip_fh->Method);
		if (zip_fh->Method != METHOD_STORED &&
			zip_fh->Method != METHOD_DEFLATE &&
			zip_fh->Method != METHOD_LZMA &&
			zip_fh->Method != METHOD_BZIP2 &&
			zip_fh->Method != METHOD_IMPLODE &&
			zip_fh->Method != METHOD_SHRINK)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' uses an unsupported compression algorithm (#%d).\n", Filename, name.GetChars(), zip_fh->Method);
			skipped++;
			continue;
		}
		// Also ignore encrypted entries
		zip_fh->Flags = LittleShort(zip_fh->Flags);
		if (zip_fh->Flags & ZF_ENCRYPTED)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' is encrypted. Encryption is not supported.\n", Filename, name.GetChars());
			skipped++;
			continue;
		}

		FixPathSeperator(name);
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = LittleLong(zip_fh->UncompressedSize);
		lump_p->Owner = this;
		// The start of the Reader will be determined the first time it is accessed.
		lump_p->Flags = LUMPF_ZIPFILE | LUMPFZIP_NEEDFILESTART;
		lump_p->Method = BYTE(zip_fh->Method);
		lump_p->GPFlags = zip_fh->Flags;
		lump_p->CRC32 = zip_fh->CRC32;
		lump_p->CompressedSize = LittleLong(zip_fh->CompressedSize);
		lump_p->Position = LittleLong(zip_fh->LocalHeaderOffset);
		lump_p->CheckEmbedded();

		// Ignore some very specific names
		if (0 == stricmp("dehacked.exe", name))
		{
			memset(lump_p->Name, 0, sizeof(lump_p->Name));
		}

		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;
	free(directory);

	if (!quiet && !batchrun) Printf(TEXTCOLOR_NORMAL ", %d lumps\n", NumLumps);
	
	PostProcessArchive(&Lumps[0], sizeof(FZipLump));
	return true;
}